

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

Vec_Int_t * Gia_ManCofVars(Gia_Man_t *p,int nFanLim)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int v;
  
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(100);
  for (v = 0; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsCand(pObj);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjRefNum(p,pObj);
      if (nFanLim <= iVar1) {
        Vec_IntPush(p_00,v);
      }
    }
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCofVars( Gia_Man_t * p, int nFanLim )
{
    Vec_Int_t * vVars;
    Gia_Obj_t * pObj;
    int i;
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    vVars = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCand(pObj) && Gia_ObjRefNum(p, pObj) >= nFanLim )
            Vec_IntPush( vVars, i );
    ABC_FREE( p->pRefs );
    return vVars;
}